

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

void __thiscall
duckdb::CatalogSet::Scan(CatalogSet *this,function<void_(duckdb::CatalogEntry_&)> *callback)

{
  bool bVar1;
  type current;
  CatalogSet *in_RDI;
  CatalogEntry *commited_entry;
  CatalogEntry *entry;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
  *kv;
  iterator __end1;
  iterator __begin1;
  case_insensitive_tree_t<unique_ptr<CatalogEntry>_> *__range1;
  lock_guard<std::mutex> lock;
  CatalogEntry *in_stack_ffffffffffffff88;
  CatalogEntry *in_stack_ffffffffffffff90;
  _Self local_30;
  _Self local_28;
  case_insensitive_tree_t<unique_ptr<CatalogEntry>_> *local_20;
  
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)in_stack_ffffffffffffff88);
  local_20 = CatalogEntryMap::Entries_abi_cxx11_(&in_RDI->map);
  local_28._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                *)in_stack_ffffffffffffff88);
  local_30._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
              *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = ::std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
                 *)0x2ab269);
    current = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
              operator*((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                         *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 = GetCommittedEntry(in_RDI,current);
    if ((in_stack_ffffffffffffff90->deleted & 1U) == 0) {
      ::std::function<void_(duckdb::CatalogEntry_&)>::operator()
                ((function<void_(duckdb::CatalogEntry_&)> *)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
    }
    ::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>
                  *)in_stack_ffffffffffffff90);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2ab300);
  return;
}

Assistant:

void CatalogSet::Scan(const std::function<void(CatalogEntry &)> &callback) {
	// lock the catalog set
	lock_guard<mutex> lock(catalog_lock);
	for (auto &kv : map.Entries()) {
		auto &entry = *kv.second;
		auto &commited_entry = GetCommittedEntry(entry);
		if (!commited_entry.deleted) {
			callback(commited_entry);
		}
	}
}